

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg3.cc
# Opt level: O2

void __thiscall trng::mrg3::mrg3(mrg3 *this,unsigned_long s,parameter_type P)

{
  int iVar1;
  int iVar2;
  
  *(long *)(this->P).a = P.a._0_8_;
  (this->P).a[2] = P.a[2];
  iVar1 = (int)((long)s % 0x7fffffff);
  iVar2 = iVar1 + 0x7fffffff;
  if (-1 < (long)s % 0x7fffffff) {
    iVar2 = iVar1;
  }
  (this->S).r[0] = iVar2;
  (this->S).r[1] = 1;
  (this->S).r[2] = 1;
  return;
}

Assistant:

mrg3::mrg3(unsigned long s, mrg3::parameter_type P) : P{P} { seed(s); }